

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f * operator*(Matrix4f *__return_storage_ptr__,Matrix4f *x,Matrix4f *y)

{
  float fVar1;
  int i;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  
  Matrix4f::Matrix4f(__return_storage_ptr__,0.0);
  lVar2 = 0;
  pfVar3 = __return_storage_ptr__->m_elements;
  for (; lVar2 != 4; lVar2 = lVar2 + 1) {
    lVar5 = 0;
    pfVar4 = y->m_elements;
    for (; lVar5 != 4; lVar5 = lVar5 + 1) {
      fVar1 = x->m_elements[lVar2 + lVar5 * 4];
      for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 0x10) {
        *(float *)((long)pfVar3 + lVar6) =
             *(float *)((long)pfVar4 + lVar6) * fVar1 + *(float *)((long)pfVar3 + lVar6);
      }
      pfVar4 = pfVar4 + 1;
    }
    pfVar3 = pfVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4f operator * ( const Matrix4f& x, const Matrix4f& y )
{
	Matrix4f product; // zeroes

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			for( int k = 0; k < 4; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}